

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  undefined1 auVar1 [16];
  uint n;
  bool bVar2;
  uint uVar3;
  int iVar4;
  void *data;
  ulong uVar5;
  FILE *pFVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  REF_DBL *pRVar11;
  long lVar12;
  void *pvVar13;
  long lVar14;
  REF_INT nterm;
  REF_INT local;
  REF_INT file_nnode;
  uint local_80;
  int local_6c;
  int local_68;
  int local_64;
  REF_GRID local_60;
  long local_58;
  FILE *local_50;
  long local_48;
  REF_DBL *local_40;
  long local_38;
  
  ref_node = ref_grid->node;
  lVar14 = ref_node->old_n_global;
  lVar12 = lVar14 / 2;
  if (ref_grid->mpi->id == 0) {
    pFVar6 = fopen(filename,"r");
    if (pFVar6 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8c9,
             "ref_part_bamg_metric","unable to open file");
      return 2;
    }
    iVar4 = __isoc99_fscanf(pFVar6,"%d %d",&local_64,&local_6c);
    if (iVar4 != 2) {
      lVar9 = (long)iVar4;
      pcVar10 = "read header";
      lVar12 = 2;
      uVar8 = 0x8ca;
LAB_0018a4be:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar8,
             "ref_part_bamg_metric",pcVar10,lVar12,lVar9);
      return 1;
    }
    lVar9 = (long)local_64;
    if (lVar12 != lVar9) {
      pcVar10 = "wrong node count";
      uVar8 = 0x8cb;
      goto LAB_0018a4be;
    }
    lVar9 = (long)local_6c;
    if (lVar9 != 3) {
      pcVar10 = "expected 3 term 2x2 anisotropic M";
      lVar12 = 3;
      uVar8 = 0x8cc;
      goto LAB_0018a4be;
    }
  }
  else {
    pFVar6 = (FILE *)0x0;
  }
  auVar1._8_8_ = lVar14 - (lVar14 >> 0x3f) >> 0x3f;
  auVar1._0_8_ = lVar12;
  auVar1 = auVar1 / SEXT816((long)ref_grid->mpi->n);
  lVar9 = (long)auVar1._0_4_;
  if (auVar1._0_8_ < 100000) {
    lVar9 = 100000;
  }
  if (lVar12 <= lVar9) {
    lVar9 = lVar12;
  }
  iVar4 = (int)lVar9;
  n = iVar4 * 3;
  local_50 = pFVar6;
  if (iVar4 < 0) {
    local_80 = 1;
    pcVar10 = "malloc metric of REF_DBL negative";
  }
  else {
    data = malloc((ulong)n << 3);
    if (data != (void *)0x0) {
      bVar2 = true;
      if (iVar4 == 0) {
        local_80 = 1;
      }
      else {
        local_80 = 1;
        uVar5 = 1;
        if (1 < (int)n) {
          uVar5 = (ulong)n;
        }
        uVar7 = 0;
        do {
          *(undefined8 *)((long)data + uVar7 * 8) = 0xbff0000000000000;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      goto LAB_0018a119;
    }
    local_80 = 2;
    pcVar10 = "malloc metric of REF_DBL NULL";
  }
  bVar2 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8d2,
         "ref_part_bamg_metric",pcVar10);
  data = (void *)0x0;
LAB_0018a119:
  if (bVar2) {
    if (1 < lVar14) {
      local_38 = (long)iVar4;
      local_40 = (REF_DBL *)((long)data + 0x10);
      lVar14 = 0;
      local_60 = ref_grid;
      do {
        pFVar6 = local_50;
        local_48 = ref_node->old_n_global - lVar14;
        if (local_38 < local_48) {
          local_48 = local_38;
        }
        local_58 = lVar14;
        if (local_60->mpi->id == 0) {
          if (0 < (int)(uint)local_48) {
            lVar14 = -(ulong)((uint)local_48 & 0x7fffffff);
            pvVar13 = data;
            do {
              iVar4 = __isoc99_fscanf(pFVar6,"%lf %lf %lf",pvVar13,(long)pvVar13 + 8,
                                      (long)pvVar13 + 0x10);
              if (iVar4 != 3) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x8dd,"ref_part_bamg_metric","metric read error",3,(long)iVar4);
                return 1;
              }
              pvVar13 = (void *)((long)pvVar13 + 0x18);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0);
          }
          uVar3 = ref_mpi_bcast(local_60->mpi,data,n,3);
          if (uVar3 != 0) {
            uVar8 = 0x8e1;
            goto LAB_0018a257;
          }
        }
        else {
          uVar3 = ref_mpi_bcast(local_60->mpi,data,n,3);
          if (uVar3 != 0) {
            uVar8 = 0x8e5;
LAB_0018a257:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar8,"ref_part_bamg_metric",(ulong)uVar3,"bcast");
            local_80 = uVar3;
          }
        }
        if (uVar3 != 0) {
          return local_80;
        }
        if (0 < (int)(uint)local_48) {
          lVar9 = -(ulong)((uint)local_48 & 0x7fffffff);
          pRVar11 = local_40;
          lVar14 = local_58;
          do {
            uVar3 = ref_node_local(ref_node,lVar14,&local_68);
            if ((uVar3 != 0) && (uVar3 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x8e9,"ref_part_bamg_metric",(ulong)uVar3,"local");
              local_80 = uVar3;
            }
            if ((uVar3 != 5) && (uVar3 != 0)) {
              return local_80;
            }
            if ((local_68 != -1) &&
               (uVar3 = ref_node_metric_form
                                  (ref_node,local_68,pRVar11[-2],pRVar11[-1],0.0,*pRVar11,0.0,1.0),
               uVar3 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x8ee,"ref_part_bamg_metric",(ulong)uVar3,"set local node met");
              return uVar3;
            }
            pRVar11 = pRVar11 + 3;
            lVar14 = lVar14 + 1;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
        }
        lVar14 = local_58 + (int)local_48;
        ref_grid = local_60;
      } while (lVar14 < lVar12);
    }
    if (data != (void *)0x0) {
      free(data);
    }
    if ((ref_grid->mpi->id == 0) && (iVar4 = fclose(local_50), iVar4 != 0)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8f5,
             "ref_part_bamg_metric","close file",0,(long)iVar4);
      local_80 = 1;
    }
    else {
      local_80 = 0;
    }
  }
  return local_80;
}

Assistant:

REF_FCN REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT file_nnode, section_size;
  REF_GLOB nnode, nnode_read, global;
  REF_INT node, local;
  REF_INT nterm;

  nnode = ref_node_n_global(ref_node) / 2;

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    REIS(2, fscanf(file, "%d %d", &file_nnode, &nterm), "read header");
    REIS(nnode, file_nnode, "wrong node count");
    REIS(3, nterm, "expected 3 term 2x2 anisotropic M");
  }

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_grid_mpi(ref_grid)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 3 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_grid_once(ref_grid)) {
      for (node = 0; node < section_size; node++) {
        REIS(3,
             fscanf(file, "%lf %lf %lf", &(metric[0 + 3 * node]),
                    &(metric[1 + 3 * node]), &(metric[2 + 3 * node])),
             "metric read error");
      }
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_form(ref_node, local, metric[0 + 3 * node],
                                 metric[1 + 3 * node], 0, metric[2 + 3 * node],
                                 0, 1),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}